

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetPWMJrkPololu(POLOLU *pPololu,int pw)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint writebuflen;
  int iVar6;
  byte local_218;
  byte local_217;
  byte local_216;
  byte local_215;
  
  iVar3 = (int)((double)(pw + -0x5dc) * pPololu->CoefPWs[0]);
  if (pPololu->bProportionalPWs[0] == 0) {
    iVar4 = iVar3 + 0x5dc;
  }
  else {
    iVar4 = pPololu->MidPWs[0];
    if (iVar3 < 0) {
      iVar5 = pPololu->MinPWs[0] - iVar4;
      iVar6 = -500;
    }
    else {
      iVar5 = pPololu->MaxPWs[0] - iVar4;
      iVar6 = 500;
    }
    iVar4 = (iVar5 * iVar3) / iVar6 + iVar4;
  }
  iVar3 = pPololu->MaxPWs[0];
  if (iVar4 < pPololu->MaxPWs[0]) {
    iVar3 = iVar4;
  }
  if (iVar3 <= pPololu->MinPWs[0]) {
    iVar3 = pPololu->MinPWs[0];
  }
  iVar5 = iVar3 - pPololu->LastPWs[0];
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  iVar5 = 0;
  if (pPololu->ThresholdPWs[0] <= iVar4) {
    iVar4 = pPololu->bEnableSetMultipleTargets;
    memset(&local_218,0,0x200);
    if (iVar4 == 0) {
      uVar2 = (long)(iVar3 * 0xfff + -0x3e7c18) / 1000;
      local_218 = (byte)uVar2 & 0x1f | 0xc0;
      local_217 = (byte)(uVar2 >> 5) & 0x7f;
      writebuflen = 2;
    }
    else {
      local_217 = (byte)pPololu->DeviceNumber;
      lVar1 = (long)(iVar3 * 0xfff + -0x3e7c18) / 1000;
      local_216 = (byte)lVar1 & 0x1f | 0x40;
      local_215 = (byte)((uint)lVar1 >> 5) & 0x7f;
      writebuflen = 4;
      local_218 = 0xaa;
    }
    iVar4 = WriteAllRS232Port(&pPololu->RS232Port,&local_218,writebuflen);
    if (iVar4 == 0) {
      if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_218,(ulong)writebuflen,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      pPololu->LastPWs[0] = iVar3;
      iVar5 = 0;
    }
    else {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

inline int SetPWMJrkPololu(POLOLU* pPololu, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;
	int channel = 0; // Only 1 motor on Jrk...

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// bEnableSetMultipleTargets is used here to choose between Pololu protocol and compact protocol modes...
	if (pPololu->bEnableSetMultipleTargets)
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[2] = (unsigned char)(0x40 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[3] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 4;
	}
	else
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[0] = (unsigned char)(0xC0 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[1] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 2;
	}

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}